

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O1

UBool copyEnumRange(void *context,UChar32 start,UChar32 end,uint32_t value)

{
  UErrorCode *pErrorCode;
  UTrie2 *trie;
  bool bVar1;
  int end_00;
  
  trie = *context;
  bVar1 = true;
  if (trie->initialValue != value) {
    end_00 = end + -1 + (uint)(*(char *)((long)context + 0xc) == '\0');
    pErrorCode = (UErrorCode *)((long)context + 8);
    if (end_00 == start) {
      if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        if ((uint)start < 0x110000) {
          set32(trie->newTrie,start,'\x01',value,pErrorCode);
        }
        else {
          *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        }
      }
    }
    else {
      utrie2_setRange32_63(trie,start,end_00,value,'\x01',pErrorCode);
    }
    bVar1 = *(int *)((long)context + 8) < 1;
  }
  return bVar1;
}

Assistant:

static UBool U_CALLCONV
copyEnumRange(const void *context, UChar32 start, UChar32 end, uint32_t value) {
    NewTrieAndStatus *nt=(NewTrieAndStatus *)context;
    if(value!=nt->trie->initialValue) {
        if(nt->exclusiveLimit) {
            --end;
        }
        if(start==end) {
            utrie2_set32(nt->trie, start, value, &nt->errorCode);
        } else {
            utrie2_setRange32(nt->trie, start, end, value, TRUE, &nt->errorCode);
        }
        return U_SUCCESS(nt->errorCode);
    } else {
        return TRUE;
    }
}